

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void av1_build_wedge_inter_predictor_from_buf
               (MACROBLOCKD *xd,BLOCK_SIZE bsize,int plane_from,int plane_to,uint8_t **ext_dst0,
               int *ext_dst_stride0,uint8_t **ext_dst1,int *ext_dst_stride1)

{
  int in_ECX;
  int in_EDX;
  undefined8 unaff_RBX;
  BLOCK_SIZE in_SIL;
  long in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  int in_stack_00000008;
  int in_stack_0000000c;
  MACROBLOCKD *in_stack_00000010;
  int bh;
  int bw;
  BLOCK_SIZE plane_bsize;
  uint8_t *in_stack_00000030;
  int plane;
  int in_stack_00000048;
  undefined4 local_34;
  
  for (local_34 = in_EDX; local_34 <= in_ECX; local_34 = local_34 + 1) {
    get_plane_block_size
              (in_SIL,*(int *)(in_RDI + (long)local_34 * 0xa30 + 0x14),
               *(int *)(in_RDI + (long)local_34 * 0xa30 + 0x18));
    build_wedge_inter_predictor_from_buf
              (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
               (int)((ulong)unaff_RBX >> 0x20),in_stack_00000030,(int)ext_dst_stride0,
               (uint8_t *)ext_dst0,in_stack_00000048);
  }
  return;
}

Assistant:

void av1_build_wedge_inter_predictor_from_buf(MACROBLOCKD *xd, BLOCK_SIZE bsize,
                                              int plane_from, int plane_to,
                                              uint8_t *ext_dst0[],
                                              int ext_dst_stride0[],
                                              uint8_t *ext_dst1[],
                                              int ext_dst_stride1[]) {
  int plane;
  assert(bsize < BLOCK_SIZES_ALL);
  for (plane = plane_from; plane <= plane_to; ++plane) {
    const BLOCK_SIZE plane_bsize = get_plane_block_size(
        bsize, xd->plane[plane].subsampling_x, xd->plane[plane].subsampling_y);
    const int bw = block_size_wide[plane_bsize];
    const int bh = block_size_high[plane_bsize];
    build_wedge_inter_predictor_from_buf(
        xd, plane, 0, 0, bw, bh, ext_dst0[plane], ext_dst_stride0[plane],
        ext_dst1[plane], ext_dst_stride1[plane]);
  }
}